

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  secp256k1_gej *psVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  secp256k1_scalar *a;
  int iVar14;
  secp256k1_fe *a_00;
  secp256k1_sha256 *psVar15;
  secp256k1_sha256 *psVar16;
  secp256k1_gej *psVar17;
  uint uVar18;
  code *pcVar19;
  ulong uVar20;
  undefined8 *puVar21;
  secp256k1_sha256 *psVar22;
  secp256k1_sha256 *a_01;
  secp256k1_ge *psVar23;
  secp256k1_fe *psVar24;
  secp256k1_fe *psVar25;
  secp256k1_fe *psVar26;
  secp256k1_gej *r_00;
  secp256k1_ge *a_02;
  secp256k1_ge *psVar27;
  uint64_t *puVar28;
  uint64_t *puVar29;
  secp256k1_gej *psVar30;
  secp256k1_sha256 *psVar31;
  int iVar32;
  ulong uVar33;
  secp256k1_sha256 *psVar34;
  ulong uVar35;
  secp256k1_gej *psVar36;
  secp256k1_gej *psVar37;
  secp256k1_gej *psVar38;
  secp256k1_sha256 *psVar39;
  secp256k1_gej *psVar40;
  secp256k1_gej *psVar41;
  bool bVar42;
  secp256k1_fe tmp;
  ulong uStack_11c0;
  undefined1 auStack_11b0 [32];
  undefined1 auStack_1190 [88];
  uint64_t uStack_1138;
  uint64_t uStack_1130;
  uint64_t uStack_1128;
  uint64_t uStack_1120;
  int iStack_1118;
  int iStack_1114;
  secp256k1_fe sStack_1110;
  undefined4 uStack_10e0;
  secp256k1_fe sStack_10d0;
  secp256k1_scalar sStack_10a0;
  secp256k1_ge sStack_1080;
  secp256k1_fe asStack_fe8 [31];
  secp256k1_ge sStack_a00;
  secp256k1_fe asStack_968 [31];
  secp256k1_sha256 *psStack_378;
  secp256k1_sha256 *psStack_370;
  secp256k1_gej *psStack_368;
  secp256k1_sha256 *psStack_360;
  secp256k1_gej *psStack_358;
  code *pcStack_350;
  undefined1 auStack_348 [56];
  uint64_t auStack_310 [5];
  secp256k1_sha256 *psStack_2e8;
  ulong uStack_2e0;
  secp256k1_sha256 *psStack_2d8;
  secp256k1_modinv64_trans2x2 sStack_2d0;
  secp256k1_sha256 *psStack_2b0;
  secp256k1_sha256 *psStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_sha256 *psStack_298;
  secp256k1_gej *psStack_290;
  code *pcStack_288;
  undefined1 auStack_280 [56];
  ulong uStack_248;
  ulong uStack_240;
  uint64_t uStack_238;
  uint64_t uStack_230;
  int iStack_228;
  int iStack_224;
  secp256k1_modinv64_signed62 sStack_220;
  secp256k1_fe sStack_1f8;
  secp256k1_fe *psStack_1c8;
  secp256k1_sha256 *psStack_1c0;
  undefined1 auStack_1b8 [48];
  undefined1 auStack_188 [192];
  ulong uStack_c8;
  secp256k1_fe *psStack_c0;
  secp256k1_fe *psStack_b8;
  secp256k1_modinv64_signed62 *psStack_b0;
  long local_a0;
  ulong local_98;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe local_68;
  
  bVar6 = 0;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x1483a9;
  secp256k1_fe_verify(x);
  local_a0 = 0x1000003d1;
  uVar8 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar35 = (uVar8 >> 0x34) + x->n[1];
  uVar11 = (uVar35 >> 0x34) + x->n[2];
  uVar12 = (uVar11 >> 0x34) + x->n[3];
  local_98 = (uVar12 >> 0x34) + (x->n[4] & 0xffffffffffff);
  pcVar19 = (code *)((uVar8 ^ 0x1000003d0) & uVar35 & uVar11 & uVar12 & (local_98 ^ 0xf000000000000)
                    );
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x148446;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x14846f;
  secp256k1_fe_normalize_var(&local_68);
  local_90.v[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_90.v[1] = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_90.v[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_90.v[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_90.v[4] = local_68.n[4] >> 0x28;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x148501;
  secp256k1_modinv64_var(&local_90,&secp256k1_const_modinfo_fe);
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x14850c;
  secp256k1_fe_from_signed62(r,&local_90);
  r->magnitude = (uint)(0 < x->magnitude);
  r->normalized = 1;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x148528;
  secp256k1_fe_verify(r);
  psVar24 = (secp256k1_fe *)(r->n[4] & 0xffffffffffff);
  uVar9 = (r->n[4] >> 0x30) * local_a0 + r->n[0];
  uVar3 = (uVar9 >> 0x34) + r->n[1];
  uVar13 = (uVar3 >> 0x34) + r->n[2];
  uVar20 = (uVar13 >> 0x34) + r->n[3];
  puVar21 = (undefined8 *)((long)psVar24->n + (uVar20 >> 0x34));
  uVar33 = (uVar9 ^ 0x1000003d0) & uVar3 & uVar13 & uVar20 & ((ulong)puVar21 ^ 0xf000000000000);
  psVar36 = (secp256k1_gej *)((uVar35 | uVar8 | uVar11 | uVar12) & 0xfffffffffffff | local_98);
  if ((pcVar19 != (code *)0xfffffffffffff && psVar36 != (secp256k1_gej *)0x0) !=
      (uVar33 == 0xfffffffffffff ||
      ((uVar3 | uVar9 | uVar13 | uVar20) & 0xfffffffffffff) == 0 && puVar21 == (undefined8 *)0x0)) {
    secp256k1_fe_verify(r);
    return;
  }
  psStack_b0 = (secp256k1_modinv64_signed62 *)secp256k1_ellswift_prng;
  secp256k1_fe_inv_var_cold_1();
  psVar22 = (secp256k1_sha256 *)(auStack_188 + 0x60);
  psVar39 = psVar22;
  psStack_c0 = r;
  psStack_b8 = x;
  psStack_b0 = &local_90;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    *(undefined8 *)psVar39->s = *puVar21;
    puVar21 = puVar21 + (ulong)bVar6 * -2 + 1;
    psVar39 = (secp256k1_sha256 *)((long)psVar39 + (ulong)bVar6 * -0x10 + 8);
  }
  uVar3 = uStack_c8 >> 6;
  auStack_188._80_8_ = 0x148618;
  secp256k1_sha256_write(psVar22,auStack_188 + 0x5c,4);
  auStack_188._80_8_ = 0x148623;
  a_00 = psVar24;
  psVar39 = psVar22;
  secp256k1_sha256_finalize(psVar22,(uchar *)psVar24);
  uVar3 = uVar3 + 1;
  if (uStack_c8 >> 6 == uVar3) {
    return;
  }
  auStack_188._80_8_ = secp256k1_ge_x_frac_on_curve_var;
  secp256k1_ellswift_prng_cold_1();
  psVar15 = (secp256k1_sha256 *)auStack_1b8;
  psVar25 = (secp256k1_fe *)auStack_1b8;
  psVar26 = (secp256k1_fe *)auStack_1b8;
  psVar40 = (secp256k1_gej *)0xfffffffffffff;
  psVar34 = (secp256k1_sha256 *)0x1000003d0;
  psStack_1c0 = (secp256k1_sha256 *)0x14866f;
  auStack_188._56_8_ = psVar24;
  auStack_188._64_8_ = uVar33;
  auStack_188._72_8_ = psVar22;
  auStack_188._80_8_ = uVar3;
  secp256k1_fe_verify(a_00);
  uVar3 = (a_00->n[4] >> 0x30) * 0x1000003d1 + a_00->n[0];
  if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
    uVar8 = (uVar3 >> 0x34) + a_00->n[1];
    psVar22 = (secp256k1_sha256 *)((uVar8 >> 0x34) + a_00->n[2]);
    psVar24 = (secp256k1_fe *)(((ulong)psVar22 >> 0x34) + a_00->n[3]);
    uVar9 = ((ulong)psVar24 >> 0x34) + (a_00->n[4] & 0xffffffffffff);
    if ((((uVar8 | uVar3 | (ulong)psVar22 | (ulong)psVar24) & 0xfffffffffffff) != 0 || uVar9 != 0)
       && (((uVar3 | 0x1000003d0) & uVar8 & (ulong)psVar22 & (ulong)psVar24 &
           (uVar9 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_00148715;
    psStack_1c0 = (secp256k1_sha256 *)0x148862;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
  }
  else {
LAB_00148715:
    psVar40 = (secp256k1_gej *)auStack_188;
    psStack_1c0 = (secp256k1_sha256 *)0x148728;
    secp256k1_fe_mul((secp256k1_fe *)psVar40,a_00,(secp256k1_fe *)psVar39);
    psStack_1c0 = (secp256k1_sha256 *)0x148736;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_1b8,(secp256k1_fe *)psVar39);
    psStack_1c0 = (secp256k1_sha256 *)0x148744;
    secp256k1_fe_mul((secp256k1_fe *)psVar40,(secp256k1_fe *)psVar40,(secp256k1_fe *)auStack_1b8);
    psStack_1c0 = (secp256k1_sha256 *)0x14874f;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_1b8,a_00);
    psStack_1c0 = (secp256k1_sha256 *)0x14875a;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_1b8,(secp256k1_fe *)auStack_1b8);
    psStack_1c0 = (secp256k1_sha256 *)0x148762;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1b8);
    psVar22 = psVar15;
    psVar24 = psVar25;
    psVar34 = (secp256k1_sha256 *)auStack_1b8;
    if ((int)auStack_1b8._40_4_ < 5) {
      auStack_1b8._40_4_ = auStack_1b8._40_4_ * 7;
      psVar22 = (secp256k1_sha256 *)(auStack_1b8._0_8_ * 7);
      auStack_1b8._8_8_ = auStack_1b8._8_8_ * 7;
      auStack_1b8._16_8_ = auStack_1b8._16_8_ * 7;
      auStack_1b8._24_8_ = auStack_1b8._24_8_ * 7;
      auStack_1b8._32_8_ = auStack_1b8._32_8_ * 7;
      auStack_1b8._44_4_ = 0;
      psStack_1c0 = (secp256k1_sha256 *)0x1487eb;
      auStack_1b8._0_8_ = psVar22;
      secp256k1_fe_verify((secp256k1_fe *)auStack_1b8);
      psVar39 = (secp256k1_sha256 *)auStack_188;
      psStack_1c0 = (secp256k1_sha256 *)0x1487f8;
      secp256k1_fe_verify((secp256k1_fe *)psVar39);
      psStack_1c0 = (secp256k1_sha256 *)0x148800;
      secp256k1_fe_verify((secp256k1_fe *)auStack_1b8);
      auStack_188._40_4_ = auStack_1b8._40_4_ + auStack_188._40_4_;
      a_00 = (secp256k1_fe *)auStack_1b8;
      psVar24 = psVar26;
      psVar34 = (secp256k1_sha256 *)auStack_1b8;
      if ((int)auStack_188._40_4_ < 0x21) {
        auStack_188._0_8_ = (long)(uint32_t *)auStack_1b8._0_8_ + auStack_188._0_8_;
        auStack_188._8_8_ = auStack_188._8_8_ + auStack_1b8._8_8_;
        auStack_188._16_8_ = auStack_188._16_8_ + auStack_1b8._16_8_;
        auStack_188._24_8_ = auStack_188._24_8_ + auStack_1b8._24_8_;
        auStack_188._32_8_ = auStack_188._32_8_ + auStack_1b8._32_8_;
        auStack_188._44_4_ = 0;
        psStack_1c0 = (secp256k1_sha256 *)0x148849;
        secp256k1_fe_verify((secp256k1_fe *)auStack_188);
        psStack_1c0 = (secp256k1_sha256 *)0x148851;
        secp256k1_fe_is_square_var((secp256k1_fe *)auStack_188);
        return;
      }
      goto LAB_00148867;
    }
  }
  psStack_1c0 = (secp256k1_sha256 *)0x148867;
  secp256k1_ge_x_frac_on_curve_var_cold_3();
LAB_00148867:
  psStack_1c0 = (secp256k1_sha256 *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_1c0 = psVar39;
  psStack_1c8 = a_00;
  r_00 = (secp256k1_gej *)auStack_280;
  psVar41 = (secp256k1_gej *)auStack_280;
  psVar15 = (secp256k1_sha256 *)auStack_280;
  auStack_280._48_8_ = psVar24->n[0];
  uStack_248 = psVar24->n[1];
  uStack_240 = psVar24->n[2];
  uStack_238 = psVar24->n[3];
  uStack_230 = psVar24->n[4];
  iStack_228 = psVar24->magnitude;
  iStack_224 = psVar24->normalized;
  pcStack_288 = (code *)0x148898;
  secp256k1_fe_verify(psVar24);
  auStack_280._0_8_ = psVar24->n[0];
  auStack_280._8_8_ = psVar24->n[1];
  auStack_280._16_8_ = psVar24->n[2];
  auStack_280._24_8_ = psVar24->n[3];
  auStack_280._32_8_ = psVar24->n[4];
  auStack_280._40_8_ = *(undefined8 *)&psVar24->magnitude;
  pcStack_288 = (code *)0x1488b9;
  secp256k1_fe_normalize_var((secp256k1_fe *)auStack_280);
  pcStack_288 = (code *)0x1488c1;
  secp256k1_fe_verify((secp256k1_fe *)auStack_280);
  if (auStack_280._44_4_ == 0) {
    pcStack_288 = (code *)0x148a5a;
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((auStack_280._16_8_ == 0 && auStack_280._24_8_ == 0) &&
        (auStack_280._8_8_ == 0 && auStack_280._0_8_ == 0)) && auStack_280._32_8_ == 0) {
      psVar15 = (secp256k1_sha256 *)0x1;
    }
    else {
      sStack_220.v[0] = (auStack_280._8_8_ << 0x34 | auStack_280._0_8_) & 0x3fffffffffffffff;
      sStack_220.v[1] =
           (ulong)((uint)auStack_280._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_280._8_8_ >> 10;
      sStack_220.v[2] =
           (ulong)((uint)auStack_280._24_8_ & 0x3fffffff) << 0x20 |
           (ulong)auStack_280._16_8_ >> 0x14;
      sStack_220.v[3] =
           (auStack_280._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_280._24_8_ >> 0x1e;
      sStack_220.v[4] = (ulong)auStack_280._32_8_ >> 0x28;
      pcStack_288 = (code *)0x14897c;
      uVar1 = secp256k1_jacobi64_maybe_var(&sStack_220,&secp256k1_const_modinfo_fe);
      if (uVar1 == 0) {
        pcStack_288 = (code *)0x1489a0;
        uVar1 = secp256k1_fe_sqrt(&sStack_1f8,(secp256k1_fe *)auStack_280);
        psVar15 = (secp256k1_sha256 *)(ulong)uVar1;
      }
      else {
        psVar15 = (secp256k1_sha256 *)(ulong)(~uVar1 >> 0x1f);
      }
    }
    psVar39 = (secp256k1_sha256 *)(auStack_280 + 0x30);
    pcStack_288 = (code *)0x1489af;
    secp256k1_fe_verify((secp256k1_fe *)psVar39);
    auStack_280._48_8_ = (uStack_230 >> 0x30) * 0x1000003d1 + auStack_280._48_8_;
    uStack_248 = ((ulong)auStack_280._48_8_ >> 0x34) + uStack_248;
    uStack_240 = (uStack_248 >> 0x34) + uStack_240;
    uVar3 = (uStack_240 >> 0x34) + uStack_238;
    uStack_238 = uVar3 & 0xfffffffffffff;
    uStack_230 = (uVar3 >> 0x34) + (uStack_230 & 0xffffffffffff);
    uStack_240 = uStack_240 & 0xfffffffffffff;
    uStack_248 = uStack_248 & 0xfffffffffffff;
    auStack_280._48_8_ = auStack_280._48_8_ & 0xfffffffffffff;
    iStack_228 = 1;
    pcStack_288 = (code *)0x148a39;
    secp256k1_fe_verify((secp256k1_fe *)psVar39);
    pcStack_288 = (code *)0x148a44;
    psVar22 = psVar39;
    iVar2 = secp256k1_fe_sqrt((secp256k1_fe *)auStack_280,(secp256k1_fe *)psVar39);
    r_00 = psVar41;
    if ((int)psVar15 == iVar2) {
      return;
    }
  }
  pcStack_288 = secp256k1_jacobi64_maybe_var;
  secp256k1_fe_is_square_var_cold_1();
  pcStack_288 = pcVar19;
  psStack_290 = psVar40;
  psStack_298 = psVar39;
  psStack_2a0 = psVar36;
  psStack_2a8 = psVar34;
  psStack_2b0 = psVar15;
  psVar37 = (secp256k1_gej *)auStack_348;
  psVar38 = (secp256k1_gej *)auStack_348;
  auStack_310[3] = *(uint64_t *)psVar22->buf;
  psVar41 = *(secp256k1_gej **)psVar22->s;
  auStack_310[1] = *(uint64_t *)(psVar22->s + 4);
  auStack_310[2] = *(uint64_t *)(psVar22->s + 6);
  auStack_348._48_8_ = psVar41;
  auStack_310[0] = *(uint64_t *)(psVar22->s + 2);
  auStack_348._0_8_ = (r_00->x).n[0];
  auStack_348._8_8_ = (r_00->x).n[1];
  auStack_348._16_8_ = (r_00->x).n[2];
  auStack_348._24_8_ = (r_00->x).n[3];
  auStack_348._32_8_ = (r_00->x).n[4];
  a_01 = psVar22;
  if (((((long)auStack_348._0_8_ < 0) || ((long)auStack_348._8_8_ < 0)) ||
      (psVar15 = psVar22, a_01 = (secp256k1_sha256 *)auStack_348._16_8_,
      (long)auStack_348._16_8_ < 0)) ||
     ((r_00 = (secp256k1_gej *)auStack_348._24_8_, (long)auStack_348._24_8_ < 0 ||
      ((long)auStack_348._32_8_ < 0)))) {
LAB_00148ef3:
    pcStack_350 = (code *)0x148ef8;
    secp256k1_jacobi64_maybe_var_cold_18();
  }
  else {
    a_01 = (secp256k1_sha256 *)
           (auStack_348._16_8_ | auStack_348._24_8_ | auStack_348._8_8_ | auStack_348._0_8_ |
           auStack_348._32_8_);
    if (a_01 != (secp256k1_sha256 *)0x0) {
      psVar39 = (secp256k1_sha256 *)0x5;
      pcVar19 = (code *)0xffffffffffffffff;
      uStack_2e0 = 0;
      psVar16 = (secp256k1_sha256 *)0x0;
      psStack_2e8 = psVar22;
      do {
        psVar15 = psStack_2e8;
        r_00 = (secp256k1_gej *)(auStack_310[0] << 0x3e | (ulong)psVar41);
        puVar28 = (uint64_t *)(auStack_348._8_8_ << 0x3e | auStack_348._0_8_);
        psVar36 = (secp256k1_gej *)0x0;
        psVar31 = (secp256k1_sha256 *)0x0;
        psVar41 = (secp256k1_gej *)0x1;
        iVar2 = 0x3e;
        psVar22 = (secp256k1_sha256 *)0x1;
        puVar29 = puVar28;
        psVar40 = r_00;
        while( true ) {
          uVar3 = -1L << ((byte)iVar2 & 0x3f) | (ulong)puVar29;
          lVar10 = 0;
          if (uVar3 != 0) {
            for (; (uVar3 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          bVar5 = (byte)lVar10;
          psVar30 = (secp256k1_gej *)((ulong)puVar29 >> (bVar5 & 0x3f));
          psVar22 = (secp256k1_sha256 *)((long)psVar22 << (bVar5 & 0x3f));
          psVar36 = (secp256k1_gej *)((long)psVar36 << (bVar5 & 0x3f));
          pcVar19 = pcVar19 + -lVar10;
          a_01 = (secp256k1_sha256 *)((ulong)psVar40 >> 2);
          uVar1 = ((uint)((ulong)psVar40 >> 1) ^ (uint)a_01) & (uint)lVar10 ^ (uint)psVar16;
          psVar34 = (secp256k1_sha256 *)(ulong)uVar1;
          iVar2 = iVar2 - (uint)lVar10;
          psStack_2d8 = psVar39;
          if (iVar2 == 0) break;
          if (((ulong)psVar40 & 1) == 0) {
            pcStack_350 = (code *)0x148ea8;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00148ea8:
            pcStack_350 = (code *)0x148ead;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00148ead:
            pcStack_350 = (code *)0x148eb2;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00148eb2:
            pcStack_350 = (code *)0x148eb7;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00148eb7;
          }
          if (((ulong)psVar30 & 1) == 0) goto LAB_00148ea8;
          a_01 = (secp256k1_sha256 *)((long)psVar36 * (long)puVar28 + (long)psVar22 * (long)r_00);
          bVar5 = 0x3e - (char)iVar2;
          psVar16 = (secp256k1_sha256 *)((long)psVar40 << (bVar5 & 0x3f));
          if (a_01 != psVar16) goto LAB_00148ead;
          psVar16 = (secp256k1_sha256 *)((long)psVar41 * (long)puVar28 + (long)psVar31 * (long)r_00)
          ;
          a_01 = (secp256k1_sha256 *)((long)psVar30 << (bVar5 & 0x3f));
          if (psVar16 != a_01) goto LAB_00148eb2;
          iVar32 = (int)psVar40;
          iVar14 = (int)psVar30;
          if ((long)pcVar19 < 0) {
            pcVar19 = (code *)-(long)pcVar19;
            iVar7 = (int)pcVar19 + 1;
            if (iVar2 <= iVar7) {
              iVar7 = iVar2;
            }
            a_01 = (secp256k1_sha256 *)(ulong)(iVar7 - 0x3fU);
            if (0xffffffc1 < iVar7 - 0x3fU) {
              psVar16 = (secp256k1_sha256 *)
                        (ulong)(uVar1 ^ (uint)(((ulong)psVar30 & (ulong)psVar40) >> 1));
              uVar3 = (ulong)(0x3fL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
              uVar1 = (iVar14 * iVar14 + 0x3e) * iVar14 * iVar32 & (uint)uVar3;
              psVar4 = psVar36;
              psVar36 = psVar41;
              psVar17 = psVar30;
              a_01 = psVar22;
              psVar22 = psVar31;
              goto LAB_00148ca0;
            }
            goto LAB_00148ec1;
          }
          iVar7 = (int)pcVar19 + 1;
          if (iVar2 <= iVar7) {
            iVar7 = iVar2;
          }
          a_01 = (secp256k1_sha256 *)(ulong)(iVar7 - 0x3fU);
          if (iVar7 - 0x3fU < 0xffffffc2) goto LAB_00148ebc;
          uVar3 = (ulong)(0xfL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
          uVar1 = -(iVar14 * ((iVar32 * 2 + 2U & 8) + iVar32)) & (uint)uVar3;
          psVar4 = psVar41;
          psVar17 = psVar40;
          a_01 = psVar31;
          psVar40 = psVar30;
          psVar16 = psVar34;
LAB_00148ca0:
          uVar8 = (ulong)uVar1;
          puVar29 = (uint64_t *)((long)(psVar40->x).n + uVar8 * (long)psVar17);
          psVar31 = (secp256k1_sha256 *)((long)a_01->s + (long)psVar22 * uVar8);
          psVar41 = (secp256k1_gej *)((long)(psVar4->x).n + uVar8 * (long)psVar36);
          psVar40 = psVar17;
          psVar34 = psVar16;
          if (((ulong)puVar29 & uVar3) != 0) {
LAB_00148eb7:
            pcStack_350 = (code *)0x148ebc;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00148ebc:
            pcStack_350 = (code *)0x148ec1;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00148ec1:
            pcStack_350 = (code *)0x148ec6;
            secp256k1_jacobi64_maybe_var_cold_5();
            goto LAB_00148ec6;
          }
        }
        r_00 = (secp256k1_gej *)((long)psVar36 * (long)psVar31);
        lVar10 = (long)psVar22 * (long)psVar41 - (long)r_00;
        uVar3 = (ulong)((secp256k1_gej *)((long)psVar22 * (long)psVar41) < r_00);
        uVar8 = SUB168(SEXT816((long)psVar22) * SEXT816((long)psVar41),8) -
                SUB168(SEXT816((long)psVar36) * SEXT816((long)psVar31),8);
        sStack_2d0.u = (int64_t)psVar22;
        sStack_2d0.v = (int64_t)psVar36;
        sStack_2d0.q = (int64_t)psVar31;
        sStack_2d0.r = (int64_t)psVar41;
        if ((lVar10 != 0x4000000000000000 || uVar8 != uVar3) &&
           (uVar8 - uVar3 != -1 || lVar10 != -0x4000000000000000)) {
LAB_00148ec6:
          pcStack_350 = (code *)0x148ecb;
          secp256k1_jacobi64_maybe_var_cold_16();
          psVar15 = psVar16;
          psVar39 = psVar22;
LAB_00148ecb:
          pcStack_350 = (code *)0x148ed0;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00148ed0:
          pcStack_350 = (code *)0x148ed5;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00148ed5:
          pcStack_350 = (code *)0x148eda;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00148eda:
          pcStack_350 = (code *)0x148edf;
          secp256k1_jacobi64_maybe_var_cold_12();
          psVar36 = (secp256k1_gej *)auStack_348;
LAB_00148edf:
          pcStack_350 = (code *)0x148ee4;
          secp256k1_jacobi64_maybe_var_cold_11();
LAB_00148ee4:
          psVar37 = psVar36;
          pcStack_350 = (code *)0x148ee9;
          secp256k1_jacobi64_maybe_var_cold_10();
LAB_00148ee9:
          pcStack_350 = (code *)0x148eee;
          secp256k1_jacobi64_maybe_var_cold_9();
          psVar38 = psVar37;
LAB_00148eee:
          pcStack_350 = (code *)0x148ef3;
          secp256k1_jacobi64_maybe_var_cold_8();
          psVar36 = psVar38;
          psVar40 = psVar41;
          goto LAB_00148ef3;
        }
        psVar41 = (secp256k1_gej *)(auStack_348 + 0x30);
        iVar14 = (int)psVar39;
        pcStack_350 = (code *)0x148d49;
        a_01 = psVar39;
        r_00 = psVar41;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar41,iVar14,
                           (secp256k1_modinv64_signed62 *)psStack_2e8,0);
        if (iVar2 < 1) goto LAB_00148ecb;
        pcStack_350 = (code *)0x148d64;
        a_01 = psVar39;
        r_00 = psVar41;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar41,iVar14,
                           (secp256k1_modinv64_signed62 *)psVar15,1);
        if (0 < iVar2) goto LAB_00148ed0;
        pcStack_350 = (code *)0x148d7c;
        a_01 = psVar39;
        r_00 = (secp256k1_gej *)auStack_348;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_348,iVar14,
                           (secp256k1_modinv64_signed62 *)psVar15,0);
        if (iVar2 < 1) goto LAB_00148ed5;
        pcStack_350 = (code *)0x148d97;
        a_01 = psVar39;
        r_00 = (secp256k1_gej *)auStack_348;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_348,iVar14,
                           (secp256k1_modinv64_signed62 *)psVar15,1);
        if (-1 < iVar2) goto LAB_00148eda;
        pcStack_350 = (code *)0x148db2;
        secp256k1_modinv64_update_fg_62_var
                  (iVar14,(secp256k1_modinv64_signed62 *)psVar41,
                   (secp256k1_modinv64_signed62 *)auStack_348,&sStack_2d0);
        psVar41 = (secp256k1_gej *)auStack_348._48_8_;
        if ((secp256k1_gej *)auStack_348._48_8_ == (secp256k1_gej *)0x1) {
          if (iVar14 < 2) {
            return;
          }
          psVar22 = (secp256k1_sha256 *)0x1;
          uVar3 = 0;
          do {
            uVar3 = uVar3 | auStack_310[(long)((long)&psVar22[-1].bytes + 7)];
            psVar22 = (secp256k1_sha256 *)((long)psVar22->s + 1);
          } while (psVar39 != psVar22);
          if (uVar3 == 0) {
            return;
          }
        }
        lVar10 = (long)iVar14;
        if ((-1 < lVar10 + -2 && auStack_310[lVar10 + -2] == 0) &&
            (&pcStack_350)[lVar10] == (code *)0x0) {
          psVar39 = (secp256k1_sha256 *)(ulong)(iVar14 - 1);
        }
        psVar36 = (secp256k1_gej *)(auStack_348 + 0x30);
        pcStack_350 = (code *)0x148e19;
        iVar14 = (int)psVar39;
        a_01 = psVar39;
        r_00 = psVar36;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar36,iVar14,
                           (secp256k1_modinv64_signed62 *)psVar15,0);
        if (iVar2 < 1) goto LAB_00148edf;
        pcStack_350 = (code *)0x148e34;
        a_01 = psVar39;
        r_00 = psVar36;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar36,iVar14,
                           (secp256k1_modinv64_signed62 *)psVar15,1);
        if (0 < iVar2) goto LAB_00148ee4;
        pcStack_350 = (code *)0x148e4f;
        a_01 = psVar39;
        r_00 = (secp256k1_gej *)auStack_348;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_348,iVar14,
                           (secp256k1_modinv64_signed62 *)psVar15,0);
        if (iVar2 < 1) goto LAB_00148ee9;
        pcStack_350 = (code *)0x148e6a;
        a_01 = psVar39;
        r_00 = (secp256k1_gej *)auStack_348;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_348,iVar14,
                           (secp256k1_modinv64_signed62 *)psVar15,1);
        if (-1 < iVar2) goto LAB_00148eee;
        uVar1 = (int)uStack_2e0 + 1;
        uStack_2e0 = (ulong)uVar1;
        psVar16 = psVar34;
        if (uVar1 == 0xc) {
          return;
        }
      } while( true );
    }
  }
  pcStack_350 = secp256k1_ecmult_const;
  secp256k1_jacobi64_maybe_var_cold_17();
  psStack_378 = psVar15;
  psStack_370 = psVar34;
  psStack_368 = psVar36;
  psStack_360 = psVar39;
  psStack_358 = psVar40;
  pcStack_350 = pcVar19;
  secp256k1_ge_verify((secp256k1_ge *)a_01);
  if ((int)a_01->bytes != 0) {
    secp256k1_gej_set_infinity(r_00);
    return;
  }
  secp256k1_scalar_add(&sStack_10a0,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(&sStack_10a0,&sStack_10a0);
  secp256k1_scalar_split_lambda
            ((secp256k1_scalar *)auStack_11b0,(secp256k1_scalar *)auStack_1190,&sStack_10a0);
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_11b0,(secp256k1_scalar *)auStack_11b0,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar23 = (secp256k1_ge *)auStack_1190;
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_1190,(secp256k1_scalar *)auStack_1190,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar3 = 0x81;
  while( true ) {
    a_02 = (secp256k1_ge *)auStack_11b0;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_11b0);
    if ((*(ulong *)(auStack_11b0 + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0) break;
    a_02 = (secp256k1_ge *)auStack_1190;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1190);
    if ((*(ulong *)(auStack_1190 + (uVar3 >> 6) * 8) & 1L << ((byte)uVar3 & 0x3f)) != 0)
    goto LAB_0014944b;
    uVar1 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar1;
    if (uVar1 == 0x100) {
      secp256k1_gej_set_ge(r_00,(secp256k1_ge *)a_01);
      secp256k1_ecmult_odd_multiples_table(0x10,&sStack_a00,&sStack_1080.x,&sStack_10d0,r_00);
      secp256k1_ge_table_set_globalz(0x10,&sStack_a00,&sStack_1080.x);
      lVar10 = 0;
      do {
        secp256k1_ge_mul_lambda
                  ((secp256k1_ge *)((long)sStack_1080.x.n + lVar10),
                   (secp256k1_ge *)((long)sStack_a00.x.n + lVar10));
        lVar10 = lVar10 + 0x68;
      } while (lVar10 != 0x680);
      iVar2 = 0x19;
      psVar23 = (secp256k1_ge *)(auStack_1190 + 0x50);
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_11b0);
        uVar1 = iVar2 * 5 + 4U >> 6;
        uVar18 = (uint)(iVar2 * 5) >> 6;
        bVar6 = (byte)(iVar2 * 5) & 0x3f;
        if (uVar1 == uVar18) {
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_11b0);
          uVar1 = uVar1 << 3;
          uVar8 = *(ulong *)(auStack_11b0 + uVar1) >> bVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1190);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1190);
          uStack_11c0 = *(ulong *)(auStack_1190 + uVar1) >> bVar6;
        }
        else {
          uVar3 = (ulong)(uVar18 << 3);
          uVar8 = *(ulong *)(auStack_11b0 + uVar3) >> bVar6 |
                  *(long *)(auStack_11b0 + uVar3 + 8) << 0x40 - bVar6;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1190);
          uStack_11c0 = *(ulong *)(auStack_1190 + uVar3) >> bVar6 |
                        *(long *)(auStack_1190 + uVar3 + 8) << 0x40 - bVar6;
        }
        uVar1 = (uint)((uVar8 & 0x10) == 0);
        uStack_1120 = sStack_a00.x.n[4];
        iStack_1118 = sStack_a00.x.magnitude;
        iStack_1114 = sStack_a00.x.normalized;
        uStack_1130 = sStack_a00.x.n[2];
        uStack_1128 = sStack_a00.x.n[3];
        auStack_1190._80_8_ = sStack_a00.x.n[0];
        uStack_1138 = sStack_a00.x.n[1];
        sStack_1110.n[0] = sStack_a00.y.n[0];
        sStack_1110.n[1] = sStack_a00.y.n[1];
        sStack_1110.n[4] = sStack_a00.y.n[4];
        sStack_1110.magnitude = sStack_a00.y.magnitude;
        sStack_1110.normalized = sStack_a00.y.normalized;
        sStack_1110.n[2] = sStack_a00.y.n[2];
        sStack_1110.n[3] = sStack_a00.y.n[3];
        uVar3 = 1;
        psVar24 = asStack_968;
        do {
          uVar18 = (uint)(((-uVar1 ^ (uint)uVar8) & 0xf) == uVar3);
          secp256k1_fe_cmov((secp256k1_fe *)psVar23,psVar24 + -1,uVar18);
          secp256k1_fe_cmov(&sStack_1110,psVar24,uVar18);
          uVar3 = uVar3 + 1;
          psVar24 = (secp256k1_fe *)(psVar24[2].n + 1);
        } while (uVar3 != 0x10);
        uStack_10e0 = 0;
        secp256k1_fe_verify(&sStack_1110);
        secp256k1_fe_verify_magnitude(&sStack_1110,1);
        auStack_1190._32_8_ = 0x3ffffbfffff0bc - sStack_1110.n[0];
        auStack_1190._40_8_ = 0x3ffffffffffffc - sStack_1110.n[1];
        auStack_1190._48_8_ = 0x3ffffffffffffc - sStack_1110.n[2];
        auStack_1190._56_8_ = 0x3ffffffffffffc - sStack_1110.n[3];
        auStack_1190._64_8_ = 0x3fffffffffffc - sStack_1110.n[4];
        auStack_1190._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_1190 + 0x20));
        secp256k1_fe_cmov(&sStack_1110,(secp256k1_fe *)(auStack_1190 + 0x20),uVar1);
        if (iVar2 == 0x19) {
          secp256k1_gej_set_ge(r_00,psVar23);
        }
        else {
          iVar14 = 5;
          do {
            secp256k1_gej_double(r_00,r_00);
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
          secp256k1_gej_add_ge(r_00,r_00,psVar23);
        }
        uVar1 = (uint)((uStack_11c0 & 0x10) == 0);
        uStack_1120 = sStack_1080.x.n[4];
        iStack_1118 = sStack_1080.x.magnitude;
        iStack_1114 = sStack_1080.x.normalized;
        uStack_1130 = sStack_1080.x.n[2];
        uStack_1128 = sStack_1080.x.n[3];
        auStack_1190._80_8_ = sStack_1080.x.n[0];
        uStack_1138 = sStack_1080.x.n[1];
        sStack_1110.n[0] = sStack_1080.y.n[0];
        sStack_1110.n[1] = sStack_1080.y.n[1];
        sStack_1110.n[4] = sStack_1080.y.n[4];
        sStack_1110.magnitude = sStack_1080.y.magnitude;
        sStack_1110.normalized = sStack_1080.y.normalized;
        sStack_1110.n[2] = sStack_1080.y.n[2];
        sStack_1110.n[3] = sStack_1080.y.n[3];
        uVar3 = 1;
        psVar24 = asStack_fe8;
        do {
          uVar18 = (uint)(((-uVar1 ^ (uint)uStack_11c0) & 0xf) == uVar3);
          secp256k1_fe_cmov((secp256k1_fe *)psVar23,psVar24 + -1,uVar18);
          secp256k1_fe_cmov(&sStack_1110,psVar24,uVar18);
          uVar3 = uVar3 + 1;
          psVar24 = (secp256k1_fe *)(psVar24[2].n + 1);
        } while (uVar3 != 0x10);
        uStack_10e0 = 0;
        secp256k1_fe_verify(&sStack_1110);
        secp256k1_fe_verify_magnitude(&sStack_1110,1);
        auStack_1190._32_8_ = 0x3ffffbfffff0bc - sStack_1110.n[0];
        auStack_1190._40_8_ = 0x3ffffffffffffc - sStack_1110.n[1];
        auStack_1190._48_8_ = 0x3ffffffffffffc - sStack_1110.n[2];
        auStack_1190._56_8_ = 0x3ffffffffffffc - sStack_1110.n[3];
        auStack_1190._64_8_ = 0x3fffffffffffc - sStack_1110.n[4];
        auStack_1190._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_1190 + 0x20));
        secp256k1_fe_cmov(&sStack_1110,(secp256k1_fe *)(auStack_1190 + 0x20),uVar1);
        secp256k1_gej_add_ge(r_00,r_00,psVar23);
        bVar42 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar42);
      secp256k1_fe_mul(&r_00->z,&r_00->z,&sStack_10d0);
      return;
    }
  }
  secp256k1_ecmult_const_cold_1();
LAB_0014944b:
  secp256k1_ecmult_const_cold_2();
  secp256k1_ge_verify(psVar23);
  psVar27 = a_02;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    (psVar27->x).n[0] = (psVar23->x).n[0];
    psVar23 = (secp256k1_ge *)((long)psVar23 + (ulong)bVar6 * -0x10 + 8);
    psVar27 = (secp256k1_ge *)((long)psVar27 + (ulong)bVar6 * -0x10 + 8);
  }
  secp256k1_fe_mul(&a_02->x,&a_02->x,&secp256k1_const_beta);
  secp256k1_ge_verify(a_02);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}